

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O0

ssize_t __thiscall
QRfbSetEncodings::read(QRfbSetEncodings *this,int __fd,void *__buf,size_t __nbytes)

{
  uint16_t uVar1;
  long lVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  long in_FS_OFFSET;
  char tmp;
  undefined1 local_9;
  long local_8;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (**(code **)(*plVar3 + 0xa0))();
  if (2 < lVar2) {
    local_9 = 0xaa;
    QIODevice::read((char *)plVar3,(longlong)&local_9);
    QIODevice::read((char *)plVar3,(longlong)this);
    uVar1 = ntohs(this->count);
    this->count = uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),2 < lVar2);
}

Assistant:

bool QRfbSetEncodings::read(QTcpSocket *s)
{
    if (s->bytesAvailable() < 3)
        return false;

    char tmp;
    s->read(&tmp, 1);        // padding
    s->read(reinterpret_cast<char *>(&count), 2);
    count = ntohs(count);

    return true;
}